

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O2

Raster * rw::Raster::createFromImage(Image *image,int32 platform)

{
  bool32 bVar1;
  Raster *pRVar2;
  int32 format;
  int32 depth;
  int32 height;
  int32 width;
  
  bVar1 = imageFindRasterFormat(image,4,&width,&height,&depth,&format,platform);
  if ((bVar1 != 0) && (pRVar2 = create(width,height,depth,format,platform), pRVar2 != (Raster *)0x0)
     ) {
    pRVar2 = setFromImage(pRVar2,image,platform);
    return pRVar2;
  }
  return (Raster *)0x0;
}

Assistant:

Raster*
Raster::createFromImage(Image *image, int32 platform)
{
	Raster *raster;
	int32 width, height, depth, format;
	if(!imageFindRasterFormat(image, TEXTURE, &width, &height, &depth, &format, platform))
		return nil;
	raster = Raster::create(width, height, depth, format, platform);
	if(raster == nil)
		return nil;
	return raster->setFromImage(image, platform);
}